

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

bool __thiscall CTransaction::ComputeHasWitness(CTransaction *this)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::begin(in_RDI);
  cVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::end(in_RDI);
  bVar2 = std::
          any_of<__gnu_cxx::__normal_iterator<CTxIn_const*,std::vector<CTxIn,std::allocator<CTxIn>>>,CTransaction::ComputeHasWitness()const::__0>
                    (cVar3._M_current,cVar4._M_current);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CTransaction::ComputeHasWitness() const
{
    return std::any_of(vin.begin(), vin.end(), [](const auto& input) {
        return !input.scriptWitness.IsNull();
    });
}